

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall kratos::Generator::remove_var(Generator *this,string *var_name)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UserException *pUVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  pVar6;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string local_68;
  string local_48;
  
  this_00 = &this->vars_;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find(&this_00->_M_t,var_name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->vars_)._M_t._M_impl.super__Rb_tree_header) {
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (var_name->_M_dataplus)._M_p;
    local_48._M_string_length = var_name->_M_string_length;
    local_48.field_2._M_allocated_capacity = (size_type)(this->name)._M_dataplus._M_p;
    local_48.field_2._8_8_ = (this->name)._M_string_length;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x18;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_68,(detail *)"Cannot find {0} from {1}",format_str,args);
    UserException::UserException(pUVar5,&local_68);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
           ::at(this_00,var_name);
  peVar1 = (pmVar4->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_01 = (pmVar4->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  iVar2 = (*(peVar1->super_IRNode)._vptr_IRNode[0x10])(peVar1);
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 0x18) != 0) {
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (peVar1->name)._M_dataplus._M_p;
    local_68._M_string_length = (peVar1->name)._M_string_length;
    format_str_00.size_ = 0xd;
    format_str_00.data_ = (char *)0x22;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_48,(detail *)"{0} still has source connection(s)",format_str_00,args_00);
    UserException::UserException(pUVar5,&local_48);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*(peVar1->super_IRNode)._vptr_IRNode[0xe])(peVar1);
  if (*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x18) != 0) {
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (peVar1->name)._M_dataplus._M_p;
    local_68._M_string_length = (peVar1->name)._M_string_length;
    format_str_01.size_ = 0xd;
    format_str_01.data_ = (char *)0x20;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_48,(detail *)"{0} still has sink connection(s)",format_str_01,args_01);
    UserException::UserException(pUVar5,&local_48);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::equal_range(&this_00->_M_t,var_name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    return;
  }
  return;
}

Assistant:

void Generator::remove_var(const std::string &var_name) {
    if (vars_.find(var_name) == vars_.end()) {
        throw UserException(::format("Cannot find {0} from {1}", var_name, name));
    }
    auto var = vars_.at(var_name);
    if (!var->sources().empty()) {
        throw UserException(::format("{0} still has source connection(s)", var->name));
    }
    if (!var->sinks().empty()) {
        throw UserException(::format("{0} still has sink connection(s)", var->name));
    }

    vars_.erase(var_name);
}